

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

unqlite_col * unqliteCollectionFetch(unqlite_vm *pVm,SyString *pName,int iFlag)

{
  int iVar1;
  unqlite_col *local_40;
  unqlite_col *puStack_30;
  int rc;
  unqlite_col *pCol;
  SyString *pSStack_20;
  int iFlag_local;
  SyString *pName_local;
  unqlite_vm *pVm_local;
  
  puStack_30 = (unqlite_col *)0x0;
  pCol._4_4_ = iFlag;
  pSStack_20 = pName;
  pName_local = (SyString *)pVm;
  puStack_30 = unqliteVmFetchCollection(pVm,pName);
  pVm_local = (unqlite_vm *)puStack_30;
  if (puStack_30 == (unqlite_col *)0x0) {
    if ((pCol._4_4_ & 4) == 0) {
      pVm_local = (unqlite_vm *)0x0;
    }
    else {
      iVar1 = unqliteVmLoadCollection
                        ((unqlite_vm *)pName_local,pSStack_20->zString,pSStack_20->nByte,0,
                         &stack0xffffffffffffffd0);
      if (iVar1 == 0) {
        local_40 = puStack_30;
      }
      else {
        local_40 = (unqlite_col *)0x0;
      }
      pVm_local = (unqlite_vm *)local_40;
    }
  }
  return (unqlite_col *)pVm_local;
}

Assistant:

UNQLITE_PRIVATE unqlite_col * unqliteCollectionFetch(
	unqlite_vm *pVm, /* Target VM */
	SyString *pName, /* Lookup key */
	int iFlag        /* Control flag */
	)
{
	unqlite_col *pCol = 0; /* cc warning */
	int rc;
	/* Check if the collection is already loaded in memory */
	pCol = unqliteVmFetchCollection(pVm,pName);
	if( pCol ){
		/* Already loaded in memory*/
		return pCol;
	}
	if( (iFlag & UNQLITE_VM_AUTO_LOAD) == 0 ){
		return 0;
	}
	/* Ask the storage engine for the collection */
	rc = unqliteVmLoadCollection(pVm,pName->zString,pName->nByte,0,&pCol);
	/* Return to the caller */
	return rc == UNQLITE_OK ? pCol : 0;
}